

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_1.c
# Opt level: O1

void another_function(void)

{
  uint uVar1;
  FILE *__stream;
  long lVar2;
  stop_t *stops;
  stop_t *local_20;
  
  __stream = fopen("../tests/data/google_sample/stops.txt","r");
  if (__stream == (FILE *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = read_all_stops((FILE *)__stream,&local_20);
    fclose(__stream);
  }
  if (0 < (int)uVar1) {
    lVar2 = 0;
    do {
      do_stuff_with_stop((stop_t *)(local_20->id + lVar2));
      lVar2 = lVar2 + 0x3b0;
    } while ((ulong)uVar1 * 0x3b0 - lVar2 != 0);
  }
  if (0 < (int)uVar1) {
    free(local_20);
  }
  return;
}

Assistant:

void another_function(void) {
    int stops_count = 0;
    stop_t *stops;

    // It's 100% up to the developer to ensure
    // that the correct file is passed
    // to the parsing functions.
    FILE *fp = fopen("../tests/data/google_sample/stops.txt", "r");
    if (fp) {
        // The function allocates all the required memory.
        stops_count = read_all_stops(fp, &stops);
        fclose(fp);
    }

    for (int i = 0; i < stops_count; i++)
        do_stuff_with_stop(&(stops[i]));

    if (stops_count > 0)
        free(stops);
}